

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile.c
# Opt level: O0

LY_ERR lysc_check_status(lysc_ctx *ctx,uint16_t flags1,void *mod1,char *name1,uint16_t flags2,
                        void *mod2,char *name2)

{
  ushort uVar1;
  ushort uVar2;
  char *pcVar3;
  char *pcVar4;
  uint16_t flg2;
  uint16_t flg1;
  void *mod2_local;
  uint16_t flags2_local;
  char *name1_local;
  void *mod1_local;
  uint16_t flags1_local;
  lysc_ctx *ctx_local;
  
  if ((flags1 & 0x1c) == 0) {
    uVar1 = 4;
  }
  else {
    uVar1 = flags1 & 0x1c;
  }
  if ((flags2 & 0x1c) == 0) {
    uVar2 = 4;
  }
  else {
    uVar2 = flags2 & 0x1c;
  }
  if ((uVar1 < uVar2) && (mod1 == mod2)) {
    if (ctx != (lysc_ctx *)0x0) {
      pcVar3 = "deprecated";
      if (uVar1 == 4) {
        pcVar3 = "current";
      }
      pcVar4 = "deprecated";
      if (uVar2 == 0x10) {
        pcVar4 = "obsolete";
      }
      ly_vlog(ctx->ctx,(char *)0x0,LYVE_REFERENCE,
              "A %s definition \"%s\" is not allowed to reference %s definition \"%s\".",pcVar3,
              name1,pcVar4,name2);
    }
    ctx_local._4_4_ = LY_EVALID;
  }
  else {
    ctx_local._4_4_ = LY_SUCCESS;
  }
  return ctx_local._4_4_;
}

Assistant:

LY_ERR
lysc_check_status(struct lysc_ctx *ctx, uint16_t flags1, void *mod1, const char *name1, uint16_t flags2, void *mod2,
        const char *name2)
{
    uint16_t flg1, flg2;

    flg1 = (flags1 & LYS_STATUS_MASK) ? (flags1 & LYS_STATUS_MASK) : LYS_STATUS_CURR;
    flg2 = (flags2 & LYS_STATUS_MASK) ? (flags2 & LYS_STATUS_MASK) : LYS_STATUS_CURR;

    if ((flg1 < flg2) && (mod1 == mod2)) {
        if (ctx) {
            LOGVAL(ctx->ctx, LYVE_REFERENCE, "A %s definition \"%s\" is not allowed to reference %s definition \"%s\".",
                    flg1 == LYS_STATUS_CURR ? "current" : "deprecated", name1,
                    flg2 == LYS_STATUS_OBSLT ? "obsolete" : "deprecated", name2);
        }
        return LY_EVALID;
    }

    return LY_SUCCESS;
}